

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomNormalLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randomnormallike
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  RandomNormalLikeLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_randomnormallike(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randomnormallike(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::RandomNormalLikeLayerParams>(arena);
    (this->layer_).randomnormallike_ = pRVar2;
  }
  return (RandomNormalLikeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomNormalLikeLayerParams* NeuralNetworkLayer::_internal_mutable_randomnormallike() {
  if (!_internal_has_randomnormallike()) {
    clear_layer();
    set_has_randomnormallike();
    layer_.randomnormallike_ = CreateMaybeMessage< ::CoreML::Specification::RandomNormalLikeLayerParams >(GetArenaForAllocation());
  }
  return layer_.randomnormallike_;
}